

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::Printer::GetSubstitutionRange
          (Printer *this,char *varname,pair<unsigned_long,_unsigned_long> *range)

{
  ulong uVar1;
  bool bVar2;
  pointer ppVar3;
  LogMessage *pLVar4;
  LogFinisher local_f9;
  LogMessage local_f8;
  LogFinisher local_b9;
  LogMessage local_b8;
  iterator local_80;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>
  local_78 [3];
  allocator local_59;
  key_type local_58;
  iterator local_38;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>
  local_30;
  const_iterator iter;
  pair<unsigned_long,_unsigned_long> *range_local;
  char *varname_local;
  Printer *this_local;
  
  iter._M_node = (_Base_ptr)range;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,varname,&local_59);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
       ::find(&this->substitutions_,&local_58);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>
  ::_Rb_tree_const_iterator(&local_30,&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  local_80._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
       ::end(&this->substitutions_);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>
  ::_Rb_tree_const_iterator(local_78,&local_80);
  bVar2 = std::operator==(&local_30,local_78);
  if (bVar2) {
    internal::LogMessage::LogMessage
              (&local_b8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/io/printer.cc"
               ,0x4d);
    pLVar4 = internal::LogMessage::operator<<(&local_b8," Undefined variable in annotation: ");
    pLVar4 = internal::LogMessage::operator<<(pLVar4,varname);
    internal::LogFinisher::operator=(&local_b9,pLVar4);
    internal::LogMessage::~LogMessage(&local_b8);
    this_local._7_1_ = false;
  }
  else {
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>
             ::operator->(&local_30);
    uVar1 = (ppVar3->second).first;
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>
             ::operator->(&local_30);
    if ((ppVar3->second).second < uVar1) {
      internal::LogMessage::LogMessage
                (&local_f8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/io/printer.cc"
                 ,0x51);
      pLVar4 = internal::LogMessage::operator<<
                         (&local_f8," Variable used for annotation used multiple times: ");
      pLVar4 = internal::LogMessage::operator<<(pLVar4,varname);
      internal::LogFinisher::operator=(&local_f9,pLVar4);
      internal::LogMessage::~LogMessage(&local_f8);
      this_local._7_1_ = false;
    }
    else {
      ppVar3 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>
               ::operator->(&local_30);
      std::pair<unsigned_long,_unsigned_long>::operator=
                ((pair<unsigned_long,_unsigned_long> *)iter._M_node,&ppVar3->second);
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Printer::GetSubstitutionRange(const char* varname,
                                   std::pair<size_t, size_t>* range) {
  std::map<string, std::pair<size_t, size_t> >::const_iterator iter =
      substitutions_.find(varname);
  if (iter == substitutions_.end()) {
    GOOGLE_LOG(DFATAL) << " Undefined variable in annotation: " << varname;
    return false;
  }
  if (iter->second.first > iter->second.second) {
    GOOGLE_LOG(DFATAL) << " Variable used for annotation used multiple times: "
                << varname;
    return false;
  }
  *range = iter->second;
  return true;
}